

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O0

void init_subpel_params(MV *src_mv,InterPredParams *inter_pred_params,SubpelParams *subpel_params,
                       int width,int height)

{
  scale_factors *sf_00;
  int iVar1;
  int val;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int in_ECX;
  int *in_RDX;
  long in_RSI;
  short *in_RDI;
  int in_R8D;
  int right;
  int bottom;
  int pos_y;
  int pos_x;
  int is_scaled;
  int orig_pos_x;
  int orig_pos_y;
  int ssy;
  int ssx;
  scale_factors *sf;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_44;
  int local_40;
  
  sf_00 = *(scale_factors **)(in_RSI + 0xa8);
  iVar1 = (int)*in_RDI * (1 << (1U - (char)*(undefined4 *)(in_RSI + 0xa4) & 0x1f)) +
          *(int *)(in_RSI + 0x78) * 0x10;
  val = (int)in_RDI[1] * (1 << (1U - (char)*(undefined4 *)(in_RSI + 0xa0) & 0x1f)) +
        *(int *)(in_RSI + 0x7c) * 0x10;
  iVar2 = av1_is_scaled((scale_factors *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (iVar2 == 0) {
    local_44 = av1_unscaled_value(iVar1,sf_00);
    local_40 = av1_unscaled_value(val,sf_00);
  }
  else {
    local_44 = av1_scaled_y(iVar1,sf_00);
    local_40 = av1_scaled_x(val,sf_00);
  }
  iVar1 = (in_ECX + 4) * 0x400;
  uVar3 = clamp(local_44 + 0x20,*(int *)(in_RSI + 0xd0),(in_R8D + 4) * 0x400);
  uVar4 = clamp(local_40 + 0x20,*(int *)(in_RSI + 0xd4),iVar1);
  in_RDX[4] = uVar4;
  in_RDX[5] = uVar3;
  in_RDX[2] = uVar4 & 0x3ff;
  in_RDX[3] = uVar3 & 0x3ff;
  *in_RDX = sf_00->x_step_q4;
  in_RDX[1] = sf_00->y_step_q4;
  return;
}

Assistant:

static inline void init_subpel_params(const MV *const src_mv,
                                      InterPredParams *const inter_pred_params,
                                      SubpelParams *subpel_params, int width,
                                      int height) {
  const struct scale_factors *sf = inter_pred_params->scale_factors;
  int ssx = inter_pred_params->subsampling_x;
  int ssy = inter_pred_params->subsampling_y;
  int orig_pos_y = inter_pred_params->pix_row << SUBPEL_BITS;
  orig_pos_y += src_mv->row * (1 << (1 - ssy));
  int orig_pos_x = inter_pred_params->pix_col << SUBPEL_BITS;
  orig_pos_x += src_mv->col * (1 << (1 - ssx));
  const int is_scaled = av1_is_scaled(sf);
  int pos_x, pos_y;
  if (LIKELY(!is_scaled)) {
    pos_y = av1_unscaled_value(orig_pos_y, sf);
    pos_x = av1_unscaled_value(orig_pos_x, sf);
  } else {
    pos_y = av1_scaled_y(orig_pos_y, sf);
    pos_x = av1_scaled_x(orig_pos_x, sf);
  }

  pos_x += SCALE_EXTRA_OFF;
  pos_y += SCALE_EXTRA_OFF;

  const int bottom = (height + AOM_INTERP_EXTEND) << SCALE_SUBPEL_BITS;
  const int right = (width + AOM_INTERP_EXTEND) << SCALE_SUBPEL_BITS;
  pos_y = clamp(pos_y, inter_pred_params->top, bottom);
  pos_x = clamp(pos_x, inter_pred_params->left, right);

  subpel_params->pos_x = pos_x;
  subpel_params->pos_y = pos_y;
  subpel_params->subpel_x = pos_x & SCALE_SUBPEL_MASK;
  subpel_params->subpel_y = pos_y & SCALE_SUBPEL_MASK;
  subpel_params->xs = sf->x_step_q4;
  subpel_params->ys = sf->y_step_q4;
}